

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QRect __thiscall
QMdiAreaPrivate::resizeToMinimumTileSize
          (QMdiAreaPrivate *this,QSize *minSubWindowSize,int subWindowCount)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  WindowType WVar6;
  int iVar7;
  int iVar8;
  QWidget *pQVar9;
  int *piVar10;
  QStyle *pQVar11;
  int in_EDX;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar12;
  int frame;
  int minAreaHeight;
  int minAreaWidth;
  QWidget *topLevel;
  int minHeight;
  int minWidth;
  int rows;
  int columns;
  QMdiArea *q;
  QSize diff;
  QRect domain;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QWidget *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  ScrollBarPolicy in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  QWidget *in_stack_ffffffffffffff18;
  int local_c4;
  QWidget *local_a8;
  int local_28;
  int local_24 [3];
  undefined1 local_18 [16];
  long local_8;
  undefined1 auVar13 [12];
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = (QWidget *)q_func(in_RDI);
  bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if ((bVar2) && (0 < in_EDX)) {
    qSqrt<double>(3.14191512005776e-317);
    local_24[2] = qCeil<double>(3.14191759038599e-317);
    local_24[1] = 1;
    piVar10 = qMax<int>(local_24 + 2,local_24 + 1);
    iVar8 = *piVar10;
    if (in_EDX % iVar8 == 0) {
      local_c4 = in_EDX / iVar8;
    }
    else {
      local_c4 = in_EDX / iVar8 + 1;
    }
    local_24[0] = local_c4;
    local_28 = 1;
    piVar10 = qMax<int>(local_24,&local_28);
    iVar1 = *piVar10;
    iVar4 = QSize::width((QSize *)0x6109b1);
    iVar5 = QSize::height((QSize *)0x6109c7);
    local_a8 = pQVar9;
    if ((in_RDI->tileCalledFromResizeEvent & 1U) == 0) {
      while( true ) {
        bVar2 = false;
        if (local_a8 != (QWidget *)0x0) {
          bVar3 = QWidget::isWindow(in_stack_ffffffffffffff00);
          bVar2 = false;
          if (!bVar3) {
            WVar6 = QWidget::windowType(in_stack_ffffffffffffff00);
            bVar2 = WVar6 != SubWindow;
          }
        }
        if (!bVar2) break;
        local_a8 = QWidget::parentWidget((QWidget *)0x610a3b);
      }
      bVar2 = QWidget::isVisible((QWidget *)0x610a81);
      if (bVar2) {
        QWidget::height((QWidget *)0x610a98);
      }
      bVar2 = QWidget::isVisible((QWidget *)0x610ab1);
      if (bVar2) {
        QWidget::width((QWidget *)0x610ac8);
      }
      pQVar11 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      iVar7 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x11,0,pQVar9);
      if (iVar7 != 0) {
        pQVar11 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,5,0,pQVar9);
      }
      QSize::QSize((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
      QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QSize::expandedTo((QSize *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (QSize *)in_stack_ffffffffffffff00);
      QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::operator-((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  (QSize *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QSize::width((QSize *)0x610bfb);
        QSize::width((QSize *)0x610c0c);
        QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QSize::height((QSize *)0x610c37);
        QWidget::resize((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      }
      if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QSize::width((QSize *)0x610c7e);
        QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        in_stack_ffffffffffffff14 = QSize::height((QSize *)0x610ca1);
        QSize::height((QSize *)0x610cb2);
        QWidget::resize((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff18 = local_a8;
      }
    }
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])QWidget::rect(in_stack_ffffffffffffff18);
    iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (iVar7 < iVar4 * iVar8) {
      QRect::setWidth((QRect *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setHorizontalScrollBarPolicy
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
      }
      else {
        QAbstractSlider::setValue
                  ((QAbstractSlider *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      }
    }
    iVar8 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (iVar8 < iVar5 * iVar1) {
      QRect::setHeight((QRect *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
      }
      else {
        QAbstractSlider::setValue
                  ((QAbstractSlider *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      }
    }
  }
  else {
    local_18 = (undefined1  [16])QWidget::rect(in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar12.x1.m_i = local_18._0_4_;
  auVar13._4_4_ = local_18._4_4_;
  QVar12.x2.m_i = local_18._8_4_;
  QVar12.y2.m_i = local_18._12_4_;
  return QVar12;
}

Assistant:

QRect QMdiAreaPrivate::resizeToMinimumTileSize(const QSize &minSubWindowSize, int subWindowCount)
{
    Q_Q(QMdiArea);
    if (!minSubWindowSize.isValid() || subWindowCount <= 0)
        return viewport->rect();

    // Calculate minimum size.
    const int columns = qMax(qCeil(qSqrt(qreal(subWindowCount))), 1);
    const int rows = qMax((subWindowCount % columns) ? (subWindowCount / columns + 1)
                                                     : (subWindowCount / columns), 1);
    const int minWidth = minSubWindowSize.width() * columns;
    const int minHeight = minSubWindowSize.height() * rows;

    // Increase area size if necessary. Scroll bars are provided if we're not able
    // to resize to the minimum size.
    if (!tileCalledFromResizeEvent) {
        QWidget *topLevel = q;
        // Find the topLevel for this area, either a real top-level or a sub-window.
        while (topLevel && !topLevel->isWindow() && topLevel->windowType() != Qt::SubWindow)
            topLevel = topLevel->parentWidget();
        // We don't want sub-subwindows to be placed at the edge, thus add 2 pixels.
        int minAreaWidth = minWidth + left + right + 2;
        int minAreaHeight = minHeight + top + bottom + 2;
        if (hbar->isVisible())
            minAreaHeight += hbar->height();
        if (vbar->isVisible())
            minAreaWidth += vbar->width();
        if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
            const int frame = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, nullptr, q);
            minAreaWidth += 2 * frame;
            minAreaHeight += 2 * frame;
        }
        const QSize diff = QSize(minAreaWidth, minAreaHeight).expandedTo(q->size()) - q->size();
        // Only resize topLevel widget if scroll bars are disabled.
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width() + diff.width(), topLevel->size().height());
        if (vbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width(), topLevel->size().height() + diff.height());
    }

    QRect domain = viewport->rect();

    // Adjust domain width and provide horizontal scroll bar.
    if (domain.width() < minWidth) {
        domain.setWidth(minWidth);
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            q->setHorizontalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            hbar->setValue(0);
    }
    // Adjust domain height and provide vertical scroll bar.
    if (domain.height() < minHeight) {
        domain.setHeight(minHeight);
        if (vbarpolicy  == Qt::ScrollBarAlwaysOff)
            q->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            vbar->setValue(0);
    }
    return domain;
}